

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_SimRsbTfo_rec(Gia_Man_t *p,int iObj,int iFanout,Vec_Int_t *vTfo)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    return;
  }
  p->pTravIds[iObj] = p->nTravIds;
  if (-1 < iObj) {
    iVar4 = 0;
    while (iObj < p->vFanoutNums->nSize) {
      if (p->vFanoutNums->pArray[(uint)iObj] <= iVar4) {
        Vec_IntPush(vTfo,iObj);
        return;
      }
      iVar1 = p->vFanout->nSize;
      if (iVar1 <= iObj) break;
      piVar2 = p->vFanout->pArray;
      uVar3 = piVar2[(uint)iObj] + iVar4;
      if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) break;
      iVar1 = piVar2[uVar3];
      if ((iFanout == -1) || (iVar1 == iFanout)) {
        Gia_SimRsbTfo_rec(p,iVar1,-1,vTfo);
      }
      iVar4 = iVar4 + 1;
      if (iObj < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_SimRsbTfo_rec( Gia_Man_t * p, int iObj, int iFanout, Vec_Int_t * vTfo )
{
    int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        if ( iFanout == -1 || iFan == iFanout )
            Gia_SimRsbTfo_rec( p, iFan, -1, vTfo );
    Vec_IntPush( vTfo, iObj );
}